

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearRegression.cpp
# Opt level: O0

string * __thiscall LinearRegression::generateGradients_abi_cxx11_(LinearRegression *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  reference ppAVar2;
  QueryCompiler *pQVar3;
  reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string labelStr;
  size_t *paramID;
  size_t *gradID;
  size_t i;
  size_t prevParamID;
  size_t prevGradID;
  ActualGradient *ag_1;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  size_t off;
  bool viewHasFreeVars;
  size_t viewID;
  string errorString;
  string gradString;
  ActualGradient ag;
  pair<unsigned_long,_unsigned_long> *viewAggPair;
  PartialGradient *pGrad;
  iterator __end1;
  iterator __begin1;
  vector<PartialGradient,_std::allocator<PartialGradient>_> *__range1;
  vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
  actualGradients;
  size_t numberOfViews;
  undefined6 in_stack_ffffffffffffec88;
  byte in_stack_ffffffffffffec8e;
  byte in_stack_ffffffffffffec8f;
  QueryCompiler *in_stack_ffffffffffffec90;
  View *in_stack_ffffffffffffec98;
  allocator_type *in_stack_ffffffffffffeca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  LinearRegression *this_00;
  string local_1330 [32];
  string local_1310 [32];
  string local_12f0 [24];
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *in_stack_ffffffffffffed28;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *in_stack_ffffffffffffed30;
  string local_12b0 [32];
  string local_1290 [32];
  string local_1270 [32];
  string local_1250 [32];
  string local_1230 [32];
  string local_1210 [32];
  string local_11f0 [32];
  string local_11d0 [32];
  string local_11b0 [32];
  string local_1190 [32];
  string local_1170 [32];
  string local_1150 [32];
  string local_1130 [32];
  string local_1110 [32];
  string local_10f0 [32];
  string local_10d0 [32];
  string local_10b0 [32];
  string local_1090 [32];
  string local_1070 [32];
  string local_1050 [32];
  string local_1030 [32];
  string local_1010 [32];
  string local_ff0 [32];
  string local_fd0 [32];
  string local_fb0 [32];
  string local_f90 [32];
  string local_f70 [32];
  string local_f50 [32];
  string local_f30 [32];
  string local_f10 [32];
  string local_ef0 [32];
  string local_ed0 [32];
  string local_eb0 [32];
  string local_e90 [32];
  string local_e70 [32];
  string local_e50 [32];
  string local_e30 [32];
  string local_e10 [32];
  string local_df0 [32];
  string local_dd0 [32];
  string local_db0 [32];
  string local_d90 [32];
  string local_d70 [32];
  string local_d50 [32];
  string local_d30 [32];
  string local_d10 [32];
  string local_cf0 [32];
  string local_cd0 [32];
  string local_cb0 [32];
  string local_c90 [32];
  string local_c70 [32];
  string local_c50 [32];
  string local_c30 [32];
  string local_c10 [32];
  reference local_bf0;
  string local_be0 [32];
  string local_bc0 [32];
  string local_ba0 [32];
  string local_b80 [32];
  string local_b60 [32];
  string local_b40 [32];
  string local_b20 [32];
  string local_b00 [32];
  string local_ae0 [32];
  string local_ac0 [32];
  string local_aa0 [32];
  string local_a80 [32];
  string local_a60 [32];
  string local_a40 [32];
  string local_a20 [32];
  string local_a00 [32];
  string local_9e0 [32];
  string local_9c0 [32];
  string local_9a0 [32];
  string local_980 [32];
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  reference local_860;
  string local_850 [32];
  string local_830 [32];
  unsigned_long *local_810;
  reference local_808;
  QueryCompiler *local_800;
  size_type local_7f8;
  size_type local_7f0;
  reference local_7e8;
  ActualGradient *local_7e0;
  __normal_iterator<ActualGradient_*,_std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>
  local_7d8;
  reference local_7d0;
  string local_7c8 [32];
  string local_7a8 [32];
  string local_788 [32];
  string local_768 [32];
  string local_748 [32];
  string local_728 [32];
  string local_708 [32];
  string local_6e8 [32];
  string local_6c8 [32];
  string local_6a8 [32];
  string local_688 [32];
  string local_668 [32];
  string local_648 [32];
  string local_628 [32];
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8 [32];
  string local_5a8 [32];
  string local_588 [32];
  string local_568 [32];
  string local_548 [32];
  string local_528 [32];
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  undefined8 local_308;
  byte local_2f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f8;
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  unsigned_long local_90;
  reference local_70;
  reference local_68;
  PartialGradient *local_60;
  __normal_iterator<PartialGradient_*,_std::vector<PartialGradient,_std::allocator<PartialGradient>_>_>
  local_58;
  vector<PartialGradient,_std::allocator<PartialGradient>_> *local_50;
  undefined1 local_31 [25];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  __rhs_00 = in_RDI;
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1ea85a);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          QueryCompiler::numberOfViews((QueryCompiler *)0x1ea862);
  this_00 = (LinearRegression *)local_31;
  local_18 = __rhs;
  std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>::allocator
            ((allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_> *)0x1ea889);
  std::
  vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
  ::vector((vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
            *)__rhs_00,(size_type)in_RDI,in_stack_ffffffffffffeca0);
  std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>::~allocator
            ((allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_> *)0x1ea8af);
  local_50 = &partialGradients;
  local_58._M_current =
       (PartialGradient *)
       std::vector<PartialGradient,_std::allocator<PartialGradient>_>::begin
                 ((vector<PartialGradient,_std::allocator<PartialGradient>_> *)
                  CONCAT17(in_stack_ffffffffffffec8f,
                           CONCAT16(in_stack_ffffffffffffec8e,in_stack_ffffffffffffec88)));
  local_60 = (PartialGradient *)
             std::vector<PartialGradient,_std::allocator<PartialGradient>_>::end
                       ((vector<PartialGradient,_std::allocator<PartialGradient>_> *)
                        CONCAT17(in_stack_ffffffffffffec8f,
                                 CONCAT16(in_stack_ffffffffffffec8e,in_stack_ffffffffffffec88)));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<PartialGradient_*,_std::vector<PartialGradient,_std::allocator<PartialGradient>_>_>
                             *)in_stack_ffffffffffffec90,
                            (__normal_iterator<PartialGradient_*,_std::vector<PartialGradient,_std::allocator<PartialGradient>_>_>
                             *)CONCAT17(in_stack_ffffffffffffec8f,
                                        CONCAT16(in_stack_ffffffffffffec8e,in_stack_ffffffffffffec88
                                                ))), bVar1) {
    local_68 = __gnu_cxx::
               __normal_iterator<PartialGradient_*,_std::vector<PartialGradient,_std::allocator<PartialGradient>_>_>
               ::operator*(&local_58);
    in_stack_ffffffffffffeca0 = (allocator_type *)0x0;
    ppAVar2 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                        (&local_68->query->_aggregates,0);
    local_70 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[](&(*ppAVar2)->_incoming,(size_type)in_stack_ffffffffffffeca0);
    ActualGradient::ActualGradient((ActualGradient *)0x1ea95c);
    local_90 = local_70->second;
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::operator=(in_stack_ffffffffffffed30,in_stack_ffffffffffffed28);
    std::
    vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
    ::operator[]((vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
                  *)(local_31 + 1),local_70->first);
    std::vector<ActualGradient,_std::allocator<ActualGradient>_>::push_back
              ((vector<ActualGradient,_std::allocator<ActualGradient>_> *)in_stack_ffffffffffffeca0,
               (value_type *)in_stack_ffffffffffffec98);
    ActualGradient::~ActualGradient((ActualGradient *)0x1ea9c2);
    __gnu_cxx::
    __normal_iterator<PartialGradient_*,_std::vector<PartialGradient,_std::allocator<PartialGradient>_>_>
    ::operator++(&local_58);
  }
  offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
  offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
  offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
  std::__cxx11::to_string((unsigned_long)this_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_190);
  offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
  offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
  offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string(local_2f0);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::~string(local_2d0);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string(local_2b0);
  for (local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_2f8 < local_18;
      local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &local_2f8->field_0x1) {
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1ead44);
    in_stack_ffffffffffffec98 =
         QueryCompiler::getView
                   (in_stack_ffffffffffffec90,
                    CONCAT17(in_stack_ffffffffffffec8f,
                             CONCAT16(in_stack_ffffffffffffec8e,in_stack_ffffffffffffec88)));
    local_2f9 = std::bitset<100UL>::any((bitset<100UL> *)0x1ead69);
    local_308 = 3;
    std::
    vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
    ::operator[]((vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
                  *)(local_31 + 1),(size_type)local_2f8);
    bVar1 = std::vector<ActualGradient,_std::allocator<ActualGradient>_>::empty
                      ((vector<ActualGradient,_std::allocator<ActualGradient>_> *)
                       in_stack_ffffffffffffeca0);
    if (!bVar1) {
      if ((local_2f9 & 1) == 0) {
        offset_abi_cxx11_(this_00,(size_t)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
        std::__cxx11::to_string((unsigned_long)this_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                       __rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
        std::__cxx11::to_string((unsigned_long)this_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                       __rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
        std::__cxx11::string::operator+=(local_b0,local_5e8);
        std::__cxx11::string::~string(local_5e8);
        std::__cxx11::string::~string(local_608);
        std::__cxx11::string::~string(local_6c8);
        std::__cxx11::string::~string(local_628);
        std::__cxx11::string::~string(local_648);
        std::__cxx11::string::~string(local_6a8);
        std::__cxx11::string::~string(local_668);
        std::__cxx11::string::~string(local_688);
        offset_abi_cxx11_(this_00,(size_t)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
        std::__cxx11::to_string((unsigned_long)this_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                       __rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
        std::__cxx11::to_string((unsigned_long)this_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                       __rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
        std::__cxx11::string::operator+=(local_210,local_6e8);
        std::__cxx11::string::~string(local_6e8);
        std::__cxx11::string::~string(local_708);
        std::__cxx11::string::~string(local_7c8);
        std::__cxx11::string::~string(local_728);
        std::__cxx11::string::~string(local_748);
        std::__cxx11::string::~string(local_7a8);
        std::__cxx11::string::~string(local_768);
        std::__cxx11::string::~string(local_788);
        local_308 = 2;
      }
      else {
        offset_abi_cxx11_(this_00,(size_t)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
        std::__cxx11::to_string((unsigned_long)this_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                       __rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
        std::__cxx11::to_string((unsigned_long)this_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                       __rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
        offset_abi_cxx11_(this_00,(size_t)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                       __rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
        std::__cxx11::string::operator+=(local_b0,local_328);
        std::__cxx11::string::~string(local_328);
        std::__cxx11::string::~string(local_348);
        std::__cxx11::string::~string(local_468);
        std::__cxx11::string::~string(local_368);
        std::__cxx11::string::~string(local_388);
        std::__cxx11::string::~string(local_448);
        std::__cxx11::string::~string(local_3a8);
        std::__cxx11::string::~string(local_3c8);
        std::__cxx11::string::~string(local_428);
        std::__cxx11::string::~string(local_3e8);
        std::__cxx11::string::~string(local_408);
        offset_abi_cxx11_(this_00,(size_t)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
        std::__cxx11::to_string((unsigned_long)this_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                       __rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
        std::__cxx11::to_string((unsigned_long)this_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                       __rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
        offset_abi_cxx11_(this_00,(size_t)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                       __rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
        std::__cxx11::string::operator+=(local_210,local_488);
        std::__cxx11::string::~string(local_488);
        std::__cxx11::string::~string(local_4a8);
        std::__cxx11::string::~string(local_5c8);
        std::__cxx11::string::~string(local_4c8);
        std::__cxx11::string::~string(local_4e8);
        std::__cxx11::string::~string(local_5a8);
        std::__cxx11::string::~string(local_508);
        std::__cxx11::string::~string(local_528);
        std::__cxx11::string::~string(local_588);
        std::__cxx11::string::~string(local_548);
        std::__cxx11::string::~string(local_568);
      }
    }
    local_7d0 = std::
                vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
                ::operator[]((vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
                              *)(local_31 + 1),(size_type)local_2f8);
    local_7d8._M_current =
         (ActualGradient *)
         std::vector<ActualGradient,_std::allocator<ActualGradient>_>::begin
                   ((vector<ActualGradient,_std::allocator<ActualGradient>_> *)
                    CONCAT17(in_stack_ffffffffffffec8f,
                             CONCAT16(in_stack_ffffffffffffec8e,in_stack_ffffffffffffec88)));
    local_7e0 = (ActualGradient *)
                std::vector<ActualGradient,_std::allocator<ActualGradient>_>::end
                          ((vector<ActualGradient,_std::allocator<ActualGradient>_> *)
                           CONCAT17(in_stack_ffffffffffffec8f,
                                    CONCAT16(in_stack_ffffffffffffec8e,in_stack_ffffffffffffec88)));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<ActualGradient_*,_std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>
                               *)in_stack_ffffffffffffec90,
                              (__normal_iterator<ActualGradient_*,_std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>
                               *)CONCAT17(in_stack_ffffffffffffec8f,
                                          CONCAT16(in_stack_ffffffffffffec8e,
                                                   in_stack_ffffffffffffec88))), bVar1) {
      local_7e8 = __gnu_cxx::
                  __normal_iterator<ActualGradient_*,_std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>
                  ::operator*(&local_7d8);
      local_7f0 = 1000;
      local_7f8 = 1000;
      local_800 = (QueryCompiler *)0x0;
      while (in_stack_ffffffffffffec90 = local_800,
            pQVar3 = (QueryCompiler *)
                     std::
                     vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ::size(&local_7e8->incVars), in_stack_ffffffffffffec90 < pQVar3) {
        local_808 = std::
                    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ::operator[](&local_7e8->incVars,(size_type)local_800);
        pvVar4 = std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::operator[](&local_7e8->incVars,(size_type)local_800);
        local_810 = &pvVar4->second;
        if (local_808->first != *(unsigned_long *)(in_RSI + 5)) {
          if ((local_7f0 != *local_810) || (local_7f8 != local_808->first)) {
            offset_abi_cxx11_(this_00,(size_t)__rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
            std::__cxx11::string::operator+=(local_210,local_830);
            std::__cxx11::string::~string(local_830);
            std::__cxx11::string::~string(local_850);
          }
          if ((local_808->first == *local_810) &&
             ((local_7f0 != *local_810 || (local_7f8 != local_808->first)))) {
            std::__cxx11::string::operator+=(local_210,"0.5 * ");
          }
          std::bitset<100UL>::operator[]
                    ((bitset<100UL> *)in_stack_ffffffffffffec98,(size_t)in_stack_ffffffffffffec90);
          in_stack_ffffffffffffec8f =
               std::bitset::reference::operator_cast_to_bool((reference *)in_stack_ffffffffffffec90)
          ;
          std::bitset<100UL>::reference::~reference(&local_860);
          if ((in_stack_ffffffffffffec8f & 1) == 0) {
            offset_abi_cxx11_(this_00,(size_t)__rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&in_RSI[5].field_2,
                       local_808->first);
            std::__cxx11::to_string((unsigned_long)this_00);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           this_00,__rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
            std::__cxx11::string::operator+=(local_b0,local_a40);
            std::__cxx11::string::~string(local_a40);
            std::__cxx11::string::~string(local_a60);
            std::__cxx11::string::~string(local_ac0);
            std::__cxx11::string::~string(local_a80);
            std::__cxx11::string::~string(local_aa0);
            if ((local_7f0 != *local_810) || (local_7f8 != local_808->first)) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&in_RSI[5].field_2
                         ,local_808->first);
              std::__cxx11::to_string((unsigned_long)this_00);
              std::operator+((char *)in_stack_ffffffffffffec98,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffec90);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
              std::__cxx11::string::operator+=(local_210,local_ae0);
              std::__cxx11::string::~string(local_ae0);
              std::__cxx11::string::~string(local_b00);
              std::__cxx11::string::~string(local_b20);
            }
          }
          else {
            offset_abi_cxx11_(this_00,(size_t)__rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
            getAttributeName_abi_cxx11_(this_00,(size_t)__rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           this_00,__rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
            getAttributeName_abi_cxx11_(this_00,(size_t)__rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           this_00,__rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
            std::__cxx11::string::operator+=(local_b0,local_880);
            std::__cxx11::string::~string(local_880);
            std::__cxx11::string::~string(local_8a0);
            std::__cxx11::string::~string(local_960);
            std::__cxx11::string::~string(local_8c0);
            std::__cxx11::string::~string(local_8e0);
            std::__cxx11::string::~string(local_940);
            std::__cxx11::string::~string(local_900);
            std::__cxx11::string::~string(local_920);
            if ((local_7f0 != *local_810) || (local_7f8 != local_808->first)) {
              getAttributeName_abi_cxx11_(this_00,(size_t)__rhs);
              std::operator+((char *)in_stack_ffffffffffffec98,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffec90);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
              getAttributeName_abi_cxx11_(this_00,(size_t)__rhs);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             this_00,__rhs);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
              std::__cxx11::string::operator+=(local_210,local_980);
              std::__cxx11::string::~string(local_980);
              std::__cxx11::string::~string(local_9a0);
              std::__cxx11::string::~string(local_a20);
              std::__cxx11::string::~string(local_9c0);
              std::__cxx11::string::~string(local_9e0);
              std::__cxx11::string::~string(local_a00);
            }
          }
          std::__cxx11::to_string((unsigned_long)this_00);
          std::operator+((char *)in_stack_ffffffffffffec98,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec90);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
          std::__cxx11::string::operator+=(local_b0,local_b40);
          std::__cxx11::string::~string(local_b40);
          std::__cxx11::string::~string(local_b60);
          std::__cxx11::string::~string(local_b80);
          if ((local_7f0 != *local_810) || (local_7f8 != local_808->first)) {
            std::__cxx11::to_string((unsigned_long)this_00);
            std::operator+((char *)in_stack_ffffffffffffec98,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec90);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
            std::__cxx11::string::operator+=(local_210,local_ba0);
            std::__cxx11::string::~string(local_ba0);
            std::__cxx11::string::~string(local_bc0);
            std::__cxx11::string::~string(local_be0);
          }
          std::bitset<100UL>::operator[]
                    ((bitset<100UL> *)in_stack_ffffffffffffec98,(size_t)in_stack_ffffffffffffec90);
          in_stack_ffffffffffffec8e =
               std::bitset::reference::operator_cast_to_bool((reference *)in_stack_ffffffffffffec90)
          ;
          std::bitset<100UL>::reference::~reference(&local_bf0);
          if ((in_stack_ffffffffffffec8e & 1) == 0) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&in_RSI[5].field_2,
                       *local_810);
            std::__cxx11::to_string((unsigned_long)this_00);
            std::operator+((char *)in_stack_ffffffffffffec98,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec90);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
            std::__cxx11::string::operator+=(local_b0,local_d90);
            std::__cxx11::string::~string(local_d90);
            std::__cxx11::string::~string(local_db0);
            std::__cxx11::string::~string(local_dd0);
            if ((local_7f0 != *local_810) || (local_7f8 != local_808->first)) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&in_RSI[5].field_2
                         ,*local_810);
              std::__cxx11::to_string((unsigned_long)this_00);
              std::operator+((char *)in_stack_ffffffffffffec98,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffec90);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
              std::__cxx11::string::operator+=(local_210,local_df0);
              std::__cxx11::string::~string(local_df0);
              std::__cxx11::string::~string(local_e10);
              std::__cxx11::string::~string(local_e30);
            }
          }
          else {
            getAttributeName_abi_cxx11_(this_00,(size_t)__rhs);
            std::operator+((char *)in_stack_ffffffffffffec98,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec90);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
            getAttributeName_abi_cxx11_(this_00,(size_t)__rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           this_00,__rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
            std::__cxx11::string::operator+=(local_b0,local_c10);
            std::__cxx11::string::~string(local_c10);
            std::__cxx11::string::~string(local_c30);
            std::__cxx11::string::~string(local_cb0);
            std::__cxx11::string::~string(local_c50);
            std::__cxx11::string::~string(local_c70);
            std::__cxx11::string::~string(local_c90);
            if ((local_7f0 != *local_810) || (local_7f8 != local_808->first)) {
              getAttributeName_abi_cxx11_(this_00,(size_t)__rhs);
              std::operator+((char *)in_stack_ffffffffffffec98,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffec90);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
              getAttributeName_abi_cxx11_(this_00,(size_t)__rhs);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             this_00,__rhs);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
              std::__cxx11::string::operator+=(local_210,local_cd0);
              std::__cxx11::string::~string(local_cd0);
              std::__cxx11::string::~string(local_cf0);
              std::__cxx11::string::~string(local_d70);
              std::__cxx11::string::~string(local_d10);
              std::__cxx11::string::~string(local_d30);
              std::__cxx11::string::~string(local_d50);
            }
          }
          local_7f0 = local_808->first;
          local_7f8 = *local_810;
        }
        local_800 = (QueryCompiler *)
                    ((long)&(local_800->_td).
                            super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    + 1);
      }
      __gnu_cxx::
      __normal_iterator<ActualGradient_*,_std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>
      ::operator++(&local_7d8);
    }
    std::
    vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
    ::operator[]((vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
                  *)(local_31 + 1),(size_type)local_2f8);
    bVar1 = std::vector<ActualGradient,_std::allocator<ActualGradient>_>::empty
                      ((vector<ActualGradient,_std::allocator<ActualGradient>_> *)
                       in_stack_ffffffffffffeca0);
    if ((!bVar1) && ((local_2f9 & 1) != 0)) {
      offset_abi_cxx11_(this_00,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
      std::__cxx11::string::operator+=(local_b0,local_e50);
      std::__cxx11::string::~string(local_e50);
      std::__cxx11::string::~string(local_e70);
      offset_abi_cxx11_(this_00,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
      std::__cxx11::string::operator+=(local_210,local_e90);
      std::__cxx11::string::~string(local_e90);
      std::__cxx11::string::~string(local_eb0);
    }
  }
  offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
  offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
  offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
  std::__cxx11::string::operator+=(local_b0,local_ed0);
  std::__cxx11::string::~string(local_ed0);
  std::__cxx11::string::~string(local_ef0);
  std::__cxx11::string::~string(local_fb0);
  std::__cxx11::string::~string(local_f10);
  std::__cxx11::string::~string(local_f30);
  std::__cxx11::string::~string(local_f90);
  std::__cxx11::string::~string(local_f50);
  std::__cxx11::string::~string(local_f70);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&in_RSI[5].field_2,
             *(size_type *)(in_RSI + 5));
  std::__cxx11::to_string((unsigned_long)this_00);
  offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
  offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
  offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
  offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
  offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
  offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
  offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
  offset_abi_cxx11_(this_00,(size_t)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__rhs)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffec98,(char *)in_stack_ffffffffffffec90);
  std::__cxx11::string::operator+=(local_210,local_ff0);
  std::__cxx11::string::~string(local_ff0);
  std::__cxx11::string::~string(local_1010);
  std::__cxx11::string::~string(local_1330);
  std::__cxx11::string::~string(local_1030);
  std::__cxx11::string::~string(local_1050);
  std::__cxx11::string::~string(local_1310);
  std::__cxx11::string::~string(local_1070);
  std::__cxx11::string::~string(local_1090);
  std::__cxx11::string::~string(local_10b0);
  std::__cxx11::string::~string(local_10d0);
  std::__cxx11::string::~string(local_10f0);
  std::__cxx11::string::~string(local_1110);
  std::__cxx11::string::~string(local_12f0);
  std::__cxx11::string::~string(local_1130);
  std::__cxx11::string::~string(local_1150);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffed30);
  std::__cxx11::string::~string(local_1170);
  std::__cxx11::string::~string(local_1190);
  std::__cxx11::string::~string(local_12b0);
  std::__cxx11::string::~string(local_11b0);
  std::__cxx11::string::~string(local_11d0);
  std::__cxx11::string::~string(local_1290);
  std::__cxx11::string::~string(local_11f0);
  std::__cxx11::string::~string(local_1210);
  std::__cxx11::string::~string(local_1270);
  std::__cxx11::string::~string(local_1230);
  std::__cxx11::string::~string(local_1250);
  std::operator+(in_RSI,__rhs_00);
  std::__cxx11::string::~string(local_fd0);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string(local_b0);
  std::
  vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
  ::~vector((vector<std::vector<ActualGradient,_std::allocator<ActualGradient>_>,_std::allocator<std::vector<ActualGradient,_std::allocator<ActualGradient>_>_>_>
             *)in_stack_ffffffffffffeca0);
  return __rhs_00;
}

Assistant:

std::string LinearRegression::generateGradients()
{
    size_t numberOfViews = _compiler->numberOfViews();

    std::vector<std::vector<ActualGradient>> actualGradients(numberOfViews);
        
    for(PartialGradient& pGrad : partialGradients)
    {
        // get view and aggregate corresponding to the query
        std::pair<size_t,size_t>& viewAggPair =
            pGrad.query->_aggregates[0]->_incoming[0];
        
        // Assign to view, the aggregate and the corresponding param, grad pair
        ActualGradient ag;
        ag.aggNum = viewAggPair.second;
        ag.incVars = pGrad.inputVariables;

        actualGradients[viewAggPair.first].push_back(ag);
    }

    // TODO: *Observations:* the view with all continuous aggregates only has one tuple
    // Ideally, we would have the corresponding params in an array so this
    // computation can be vectorized ! Ideally also the gradients should be a vector !
    
    std::string gradString =  offset(1)+"void computeGradient()\n"+offset(1)+"{\n"+
        offset(2)+"memset(grad, 0, numberOfParameters * "+
        std::to_string(sizeof(double))+");\n";

    std::string errorString =  offset(1)+"void computeError()\n"+offset(1)+"{\n"+
        offset(2)+"error = 0.0;\n";
    
    for (size_t viewID = 0; viewID < numberOfViews; ++viewID)
    {
        // TODO: check if this view has at least one free variable
        // If it does not then avoid the for loop, get the tuple reference and
        // adjust the offset
        bool viewHasFreeVars = _compiler->getView(viewID)->_fVars.any();
        size_t off = 3;
        
        if (!actualGradients[viewID].empty())
        {
            if (viewHasFreeVars)
            {
                gradString += offset(2)+"for (V"+std::to_string(viewID)+
                    "_tuple& tuple : V"+std::to_string(viewID)+")\n"+offset(2)+"{\n";
                errorString += offset(2)+"for (V"+std::to_string(viewID)+
                    "_tuple& tuple : V"+std::to_string(viewID)+")\n"+offset(2)+"{\n";
            }
            else
            {
                gradString += offset(2)+"V"+std::to_string(viewID)+
                    "_tuple& tuple = V"+std::to_string(viewID)+"[0];\n";
                errorString += offset(2)+"V"+std::to_string(viewID)+
                    "_tuple& tuple = V"+std::to_string(viewID)+"[0];\n";
                off = 2;
            }
        }
        
        for (ActualGradient& ag : actualGradients[viewID])
        {
            size_t prevGradID = 1000;
            size_t prevParamID = 1000;

            // TODO: TODO: We go at great length to avoid adding errors twice
            // here, this could surely be simplified by adding each combination
            // to actualGradients only once!
            
            for (size_t i = 0; i < ag.incVars.size(); i++)
            {
                size_t& gradID = ag.incVars[i].first;
                size_t& paramID = ag.incVars[i].second;

                if (gradID == labelID)
                    continue;

                if (prevGradID != paramID || prevParamID != gradID) 
                    errorString += offset(off)+ "error += ";

                if (gradID == paramID &&
                    (prevGradID != paramID || prevParamID != gradID))
                    errorString += "0.5 * ";
                
                if (_categoricalFeatures[gradID])
                {   
                    gradString += offset(off)+"grad[index_"+getAttributeName(gradID)+
                        "[tuple."+getAttributeName(gradID)+"]] += ";

                    if (prevGradID != paramID || prevParamID != gradID)
                        errorString += "params[index_"+getAttributeName(gradID)+
                            "[tuple."+getAttributeName(gradID)+"]] * ";
                }
                else
                {
                    gradString += offset(off)+"grad["+
                        std::to_string(_parameterIndex[gradID])+"] += ";
                    
                    if (prevGradID != paramID || prevParamID != gradID)
                        errorString += "params["+
                            std::to_string(_parameterIndex[gradID])+"] * ";
                }
                
                gradString += "tuple.aggregates["+std::to_string(ag.aggNum)+"] * ";

                if (prevGradID != paramID || prevParamID != gradID)
                    errorString += "tuple.aggregates["+std::to_string(ag.aggNum)+"] * ";
            
                if (_categoricalFeatures[paramID])
                {
                    gradString += "params[index_"+getAttributeName(paramID)+
                        "[tuple."+getAttributeName(paramID)+"]];\n";
                    
                    if (prevGradID != paramID || prevParamID != gradID)
                        errorString += "params[index_"+getAttributeName(paramID)+
                            "[tuple."+getAttributeName(paramID)+"]];\n";
                }
                else
                {
                    // gradString += "param_"+getAttributeName(paramID)+";\n";
                    gradString += "params["+
                        std::to_string(_parameterIndex[paramID])+"];\n";

                    if (prevGradID != paramID || prevParamID != gradID)
                        errorString += "params["+
                            std::to_string(_parameterIndex[paramID])+"];\n";
                }

                prevGradID = gradID;
                prevParamID = paramID;
            }
        }
        if (!actualGradients[viewID].empty() && viewHasFreeVars)
        {    
            gradString += offset(2)+"}\n";
            errorString += offset(2)+"}\n";
        }
        
    }
    gradString += offset(2)+"for (size_t j = 0; j < numberOfParameters; ++j)\n"+
        offset(3)+"grad[j] /= tuple.aggregates[0];\n"+
        offset(1)+"}\n\n";

    std::string labelStr = std::to_string(_parameterIndex[labelID]);
    
    errorString +=  offset(2)+"error /= tuple.aggregates[0];\n\n"+
        offset(2)+"double paramNorm = 0.0;\n"+
        offset(2)+"/* Adding the regulariser to the error */\n"+
        offset(2)+"for (size_t j = 1; j < numberOfParameters; ++j)\n"+
        offset(3)+"paramNorm += params[j] * params[j];\n"+
        offset(2)+"paramNorm -= params["+labelStr+"] * params["+labelStr+"];\n\n"+
        offset(2)+"error += lambda[1] * paramNorm;\n"+
        offset(1)+"}\n";

    return gradString + errorString;
}